

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O1

bool Js::AsmJSCompiler::CheckFunctionTables(AsmJsModuleCompiler *m)

{
  uint size;
  AsmJSParser *ppPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeVar *pPVar6;
  ParseNodeArrLit *pPVar7;
  PropertyName name;
  IdentPtr name_00;
  AsmJsSymbol *pAVar8;
  char16_t *fmt;
  ParseNode *this;
  int iVar9;
  ParseNode *this_00;
  int32 iVar10;
  byte local_31;
  
  ppPVar1 = m->mCurrentParserNode;
  if ((*ppPVar1)->nop != knopList) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                ,0x2df,"(list->nop == knopList)","list->nop == knopList");
    if (!bVar3) {
LAB_009427f2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  iVar10 = 0;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if ((*ppPVar1)->nop == knopEndCode) goto LAB_009427c2;
    pPVar5 = ParseNode::AsParseNodeBin(*ppPVar1);
    this = pPVar5->pnode1;
    iVar9 = 5;
    if ((((byte)(this->nop + ~knopList) < 2) &&
        (pPVar6 = ParseNode::AsParseNodeVar(this), pPVar6->pnodeInit != (ParseNodePtr)0x0)) &&
       (pPVar6 = ParseNode::AsParseNodeVar(this), pPVar6->pnodeInit->nop == knopArray)) {
      pPVar6 = ParseNode::AsParseNodeVar(this);
      pPVar7 = ParseNode::AsParseNodeArrLit(pPVar6->pnodeInit);
      size = pPVar7->count;
      name = ParseNode::name(this);
      if (((int)size < 1) || ((size + 0x7fffffff & size) != 0)) {
        fmt = L"Function table [%s] size must be a power of 2";
LAB_00942761:
        local_31 = AsmJsModuleCompiler::FailName(m,this,fmt,name);
        iVar9 = 1;
      }
      else {
        bVar3 = AsmJsModuleCompiler::AddFunctionTable(m,name,size);
        name_00 = ParseNode::name(this);
        if (bVar3) {
          pAVar8 = AsmJsModuleCompiler::LookupIdentifier(m,name_00,(AsmJsFunc *)0x0,(Source *)0x0);
          if (pAVar8 == (AsmJsSymbol *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar4 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                        ,0x2f8,"(ftable)","ftable");
            if (!bVar3) goto LAB_009427f2;
            *puVar4 = 0;
          }
          pPVar6 = ParseNode::AsParseNodeVar(this);
          pPVar7 = ParseNode::AsParseNodeArrLit(pPVar6->pnodeInit);
          this_00 = (pPVar7->super_ParseNodeUni).pnode1;
          if (this_00->nop == knopList) {
            pPVar5 = ParseNode::AsParseNodeBin(this_00);
            this_00 = pPVar5->pnode1;
          }
          if ((this_00->nop != knopName) && (this_00->nop != knopStr)) {
            name = ParseNode::name(this);
            fmt = L"Invalid element in function table %s";
            this = this_00;
            goto LAB_00942761;
          }
          iVar10 = iVar10 + 1;
          pPVar5 = ParseNode::AsParseNodeBin(*ppPVar1);
          *ppPVar1 = pPVar5->pnode2;
          iVar9 = 0;
        }
        else {
          local_31 = AsmJsModuleCompiler::FailName
                               (m,this,L"Unable to create new function table %s",name_00);
          iVar9 = 1;
        }
      }
    }
  } while (iVar9 == 0);
  if (iVar9 == 5) {
LAB_009427c2:
    m->mFuncPtrTableCount = iVar10;
    *m->mCurrentParserNode = *ppPVar1;
    local_31 = 1;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool AsmJSCompiler::CheckFunctionTables(AsmJsModuleCompiler &m)
    {
        AsmJSParser& list = m.GetCurrentParserNode();
        Assert(list->nop == knopList);

        int32 funcPtrTableCount = 0;
        while (list->nop != knopEndCode)
        {
            ParseNode * varStmt = ParserWrapper::GetBinaryLeft(list);
            if (varStmt->nop != knopConstDecl && varStmt->nop != knopVarDecl)
            {
                break;
            }
            if (!varStmt->AsParseNodeVar()->pnodeInit || varStmt->AsParseNodeVar()->pnodeInit->nop != knopArray)
            {
                break;
            }
            const uint tableSize = varStmt->AsParseNodeVar()->pnodeInit->AsParseNodeArrLit()->count;
            if (!::Math::IsPow2(tableSize))
            {
                return m.FailName(varStmt, _u("Function table [%s] size must be a power of 2"), varStmt->name());
            }
            if (!m.AddFunctionTable(varStmt->name(), tableSize))
            {
                return m.FailName(varStmt, _u("Unable to create new function table %s"), varStmt->name());
            }

            AsmJsFunctionTable* ftable = (AsmJsFunctionTable*)m.LookupIdentifier(varStmt->name());
            Assert(ftable);
            ParseNode* pnode = varStmt->AsParseNodeVar()->pnodeInit->AsParseNodeArrLit()->pnode1;
            if (pnode->nop == knopList)
            {
                pnode = ParserWrapper::GetBinaryLeft(pnode);
            }
            if (!ParserWrapper::IsNameDeclaration(pnode))
            {
                return m.FailName(pnode, _u("Invalid element in function table %s"), varStmt->name());
            }
            ++funcPtrTableCount;
            list = ParserWrapper::GetBinaryRight(list);
        }

        m.SetFuncPtrTableCount(funcPtrTableCount);

        m.SetCurrentParseNode(list);
        return true;
    }